

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_object_impl.hpp
# Opt level: O1

io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor> *
__thiscall
asio::detail::
io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
operator=(io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
          *this,io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                *other)

{
  if (this != other) {
    reactive_socket_service_base::destroy
              (&this->service_->super_reactive_socket_service_base,
               &(this->implementation_).super_base_implementation_type);
    (this->implementation_).super_base_implementation_type.socket_ =
         (other->implementation_).super_base_implementation_type.socket_;
    (other->implementation_).super_base_implementation_type.socket_ = -1;
    (this->implementation_).super_base_implementation_type.state_ =
         (other->implementation_).super_base_implementation_type.state_;
    (other->implementation_).super_base_implementation_type.state_ = '\0';
    (this->implementation_).super_base_implementation_type.reactor_data_ =
         (other->implementation_).super_base_implementation_type.reactor_data_;
    (other->implementation_).super_base_implementation_type.reactor_data_ = (per_descriptor_data)0x0
    ;
    (this->implementation_).protocol_.family_ = (other->implementation_).protocol_.family_;
    (other->implementation_).protocol_.family_ = 2;
    (*((this->executor_).
       super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
       .super_any_executor_base.object_fns_)->destroy)((any_executor_base *)&this->executor_);
    execution::
    any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
    ::any_executor(&(this->executor_).
                    super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                   ,&(other->executor_).
                     super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                  );
    this->service_ = other->service_;
  }
  return this;
}

Assistant:

io_object_impl& operator=(io_object_impl&& other)
  {
    if (this != &other)
    {
      service_->move_assign(implementation_,
          *other.service_, other.implementation_);
      executor_.~executor_type();
      new (&executor_) executor_type(other.executor_);
      service_ = other.service_;
    }
    return *this;
  }